

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O2

void Ifn_NtkMatchPrintConfig(Ifn_Ntk_t *p,sat_solver *pSat)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  Ifn_Obj_t *pIVar4;
  uint v;
  
  v = p->nObjs;
  do {
    if (p->nPars <= (int)v) {
      return;
    }
    lVar3 = (long)p->nInps;
    pIVar4 = p->Nodes + lVar3;
    for (; lVar3 < p->nObjs; lVar3 = lVar3 + 1) {
      if (((*(uint *)pIVar4 & 7) == 6) && ((*(uint *)pIVar4 >> 8 & 0xff) == v)) {
        putchar(0x20);
        goto LAB_00335519;
      }
      pIVar4 = pIVar4 + 1;
    }
    iVar1 = v - p->nParsVIni;
    if (p->nParsVIni <= (int)v) {
      if (iVar1 % p->nParsVNum == 0) {
        printf(" %d=",(long)iVar1 / (long)p->nParsVNum & 0xffffffff);
      }
    }
LAB_00335519:
    uVar2 = sat_solver_var_value(pSat,v);
    printf("%d",(ulong)uVar2);
    v = v + 1;
  } while( true );
}

Assistant:

void Ifn_NtkMatchPrintConfig( Ifn_Ntk_t * p, sat_solver * pSat )
{
    int v, i;
    for ( v = p->nObjs; v < p->nPars; v++ )
    {
        for ( i = p->nInps; i < p->nObjs; i++ )
            if ( p->Nodes[i].Type == IFN_DSD_PRIME && (int)p->Nodes[i].iFirst == v )
                break;
        if ( i < p->nObjs )
            printf( " " );
        else if ( v >= p->nParsVIni && (v - p->nParsVIni) % p->nParsVNum == 0 )
            printf( " %d=", (v - p->nParsVIni) / p->nParsVNum );
        printf( "%d", sat_solver_var_value(pSat, v) );
    }
}